

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  bool bVar6;
  ZSTD_frameSizeInfo ZVar7;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_58;
  
  if (srcSize < 5) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        if (srcSize < 8) {
          return 0xfffffffffffffffe;
        }
        if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
          return 0xfffffffffffffffe;
        }
        uVar1 = (ulong)*(uint *)((long)src + 4) + 8;
        uVar3 = uVar1;
        if (srcSize < uVar1) {
          uVar3 = 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar3) {
          return 0xfffffffffffffffe;
        }
        if (srcSize < uVar3) {
          __assert_fail("skippableSize <= srcSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5b24,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)"
                       );
        }
      }
      else {
        sVar2 = ZSTD_getFrameHeader_advanced(&local_58,src,srcSize,ZSTD_f_zstd1);
        uVar1 = local_58.frameContentSize;
        if (local_58.frameType == ZSTD_skippableFrame) {
          uVar1 = 0;
        }
        if (sVar2 != 0) {
          uVar1 = 0xfffffffffffffffe;
        }
        if (0xfffffffffffffffd < uVar1) {
          return uVar1;
        }
        bVar6 = CARRY8(uVar5,uVar1);
        uVar5 = uVar5 + uVar1;
        if (bVar6) {
          return 0xfffffffffffffffe;
        }
        ZVar7 = ZSTD_findFrameSizeInfo(src,srcSize);
        uVar1 = ZVar7.compressedSize;
        if (0xffffffffffffff88 < uVar1) {
          return 0xfffffffffffffffe;
        }
      }
      src = (void *)((long)src + uVar1);
      srcSize = srcSize - uVar1;
    } while (4 < srcSize);
  }
  uVar4 = 0xfffffffffffffffe;
  if (srcSize == 0) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const ret = ZSTD_getFrameContentSize(src, srcSize);
            if (ret >= ZSTD_CONTENTSIZE_ERROR) return ret;

            /* check for overflow */
            if (totalDstSize + ret < totalDstSize) return ZSTD_CONTENTSIZE_ERROR;
            totalDstSize += ret;
        }
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}